

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O3

int ecdh_sha2_nistp(LIBSSH2_SESSION *session,libssh2_curve_type type,uchar *data,size_t data_len,
                   uchar *public_key,size_t public_key_len,EVP_PKEY *private_key,
                   kmdhgGPshakex_state_t *exchange_state)

{
  uchar **data_00;
  size_t *outlen;
  kmdhgGPshakex_state_t *pkVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  BIGNUM *pBVar9;
  size_t sVar10;
  LIBSSH2_HOSTKEY_METHOD *pLVar11;
  uchar *puVar12;
  uchar *puVar13;
  LIBSSH2_CRYPT_METHOD *pLVar14;
  _LIBSSH2_MAC_METHOD *p_Var15;
  LIBSSH2_COMP_METHOD *pLVar16;
  char *pcVar17;
  ulong uVar18;
  long lVar19;
  uchar *puVar20;
  size_t sVar21;
  kmdhgGPshakex_state_t *pkVar22;
  size_t sVar23;
  EVP_MD_CTX *fingerprint_ctx;
  kmdhgGPshakex_state_t *local_90;
  uchar *local_88;
  uchar *local_80;
  size_t server_public_key_len;
  uchar *server_public_key;
  uint local_64;
  EVP_MD_CTX *hash;
  uchar *local_58;
  size_t local_50;
  void **local_48;
  size_t *local_40;
  uchar **local_38;
  
  if (data_len < 5) {
    iVar2 = _libssh2_error(session,-10,"Host key data is too short");
    return iVar2;
  }
  local_90 = exchange_state;
  iVar2 = 0;
  switch(exchange_state->state) {
  case libssh2_NB_state_idle:
    pBVar9 = BN_new();
    local_90->k = (BIGNUM *)pBVar9;
    local_90->state = libssh2_NB_state_created;
    break;
  default:
    goto switchD_001162d4_caseD_1;
  case libssh2_NB_state_created:
    break;
  case libssh2_NB_state_sent:
    goto switchD_001162d4_caseD_3;
  case libssh2_NB_state_sent2:
    goto switchD_001162d4_caseD_5;
  }
  local_58 = data + 1;
  local_80 = (uchar *)public_key_len;
  hash = (EVP_MD_CTX *)data;
  local_50 = data_len;
  iVar2 = _libssh2_copy_string
                    (session,(string_buf *)&hash,&session->server_hostkey,&server_public_key_len);
  if (iVar2 == 0) {
    session->server_hostkey_len = (uint32_t)server_public_key_len;
    iVar2 = _libssh2_md5_init(&fingerprint_ctx);
    if ((iVar2 == 0) ||
       (iVar2 = _libssh2_md5_update(&fingerprint_ctx,session->server_hostkey,
                                    (ulong)session->server_hostkey_len), iVar2 == 0)) {
LAB_00116384:
      iVar8 = 0;
    }
    else {
      iVar2 = _libssh2_md5_final(&fingerprint_ctx,session->server_hostkey_md5);
      iVar8 = 1;
      if (iVar2 == 0) goto LAB_00116384;
    }
    session->server_hostkey_md5_valid = iVar8;
    iVar2 = _libssh2_sha1_init(&fingerprint_ctx);
    if ((iVar2 == 0) ||
       (iVar2 = _libssh2_sha1_update
                          (&fingerprint_ctx,session->server_hostkey,
                           (ulong)session->server_hostkey_len), iVar2 == 0)) {
LAB_001163cf:
      iVar8 = 0;
    }
    else {
      iVar2 = _libssh2_sha1_final(&fingerprint_ctx,session->server_hostkey_sha1);
      iVar8 = 1;
      if (iVar2 == 0) goto LAB_001163cf;
    }
    session->server_hostkey_sha1_valid = iVar8;
    iVar2 = _libssh2_sha256_init(&fingerprint_ctx);
    if ((iVar2 == 0) ||
       (iVar2 = _libssh2_sha256_update
                          (&fingerprint_ctx,session->server_hostkey,
                           (ulong)session->server_hostkey_len), iVar2 == 0)) {
LAB_0011641a:
      iVar8 = 0;
    }
    else {
      iVar2 = _libssh2_sha256_final(&fingerprint_ctx,session->server_hostkey_sha256);
      iVar8 = 1;
      if (iVar2 == 0) goto LAB_0011641a;
    }
    session->server_hostkey_sha256_valid = iVar8;
    iVar2 = (*session->hostkey->init)
                      (session,session->server_hostkey,(ulong)session->server_hostkey_len,
                       &session->server_hostkey_abstract);
    if (iVar2 == 0) {
      iVar2 = _libssh2_get_string((string_buf *)&hash,&server_public_key,&server_public_key_len);
      pkVar1 = local_90;
      if (iVar2 == 0) {
        local_38 = &local_90->h_sig;
        outlen = &local_90->h_sig_len;
        iVar2 = _libssh2_get_string((string_buf *)&hash,local_38,outlen);
        if (iVar2 != 0) {
          pcVar17 = "Unexpected ECDH server sig length";
          goto LAB_00116451;
        }
        local_40 = outlen;
        iVar2 = _libssh2_ecdh_gen_k(&pkVar1->k,private_key,
                                    (uchar *)CONCAT44(server_public_key._4_4_,(int)server_public_key
                                                     ),
                                    CONCAT44(server_public_key_len._4_4_,
                                             (uint32_t)server_public_key_len));
        if (iVar2 == 0) {
          local_48 = &session->server_hostkey_abstract;
          iVar8 = BN_num_bits((BIGNUM *)pkVar1->k);
          iVar2 = iVar8 + 0xe;
          if (-1 < iVar8 + 7) {
            iVar2 = iVar8 + 7;
          }
          pkVar1->k_value_len = (long)((iVar2 >> 3) + 5);
          uVar3 = BN_num_bits((BIGNUM *)pkVar1->k);
          sVar23 = pkVar1->k_value_len;
          if ((uVar3 & 7) != 0) {
            sVar23 = sVar23 - 1;
            pkVar1->k_value_len = sVar23;
          }
          puVar12 = (uchar *)(*session->alloc)(sVar23,&session->abstract);
          pkVar1->k_value = puVar12;
          if (puVar12 == (uchar *)0x0) {
            pcVar17 = "Unable to allocate buffer for ECDH K";
            goto LAB_0011632a;
          }
          _libssh2_htonu32(puVar12,(int)pkVar1->k_value_len - 4);
          uVar3 = BN_num_bits((BIGNUM *)pkVar1->k);
          lVar19 = 4;
          if ((uVar3 & 7) == 0) {
            pkVar1->k_value[4] = '\0';
            lVar19 = 5;
          }
          BN_bn2bin((BIGNUM *)pkVar1->k,pkVar1->k_value + lVar19);
          pkVar22 = pkVar1;
          if (type == LIBSSH2_EC_CURVE_NISTP521) {
            iVar8 = _libssh2_sha512_init(&fingerprint_ctx);
            iVar2 = -1;
            if (iVar8 != 0) {
              pkVar1->exchange_hash = &fingerprint_ctx;
              puVar13 = (session->local).banner;
              puVar12 = pkVar1->h_sig_comp;
              if (puVar13 == (uchar *)0x0) {
                _libssh2_htonu32(puVar12,0x1a);
                uVar3 = _libssh2_sha512_update(&fingerprint_ctx,puVar12,4);
                pcVar17 = "SSH-2.0-libssh2_1.11.1_DEV";
                sVar23 = 0x1a;
              }
              else {
                sVar10 = strlen((char *)puVar13);
                _libssh2_htonu32(puVar12,(int)sVar10 - 2);
                uVar3 = _libssh2_sha512_update(&fingerprint_ctx,puVar12,4);
                pcVar17 = (char *)(session->local).banner;
                sVar10 = strlen(pcVar17);
                sVar23 = sVar10 - 2;
              }
              uVar4 = _libssh2_sha512_update(&fingerprint_ctx,pcVar17,sVar23);
              local_88._0_4_ = uVar4 & uVar3 & 1;
              sVar10 = strlen((char *)(session->remote).banner);
              _libssh2_htonu32(puVar12,(uint32_t)sVar10);
              uVar3 = _libssh2_sha512_update(&fingerprint_ctx,puVar12,4);
              puVar13 = (session->remote).banner;
              sVar10 = strlen((char *)puVar13);
              uVar4 = _libssh2_sha512_update(&fingerprint_ctx,puVar13,sVar10);
              _libssh2_htonu32(puVar12,(uint32_t)(session->local).kexinit_len);
              uVar5 = _libssh2_sha512_update(&fingerprint_ctx,puVar12,4);
              uVar6 = _libssh2_sha512_update
                                (&fingerprint_ctx,(session->local).kexinit,
                                 (session->local).kexinit_len);
              local_88 = (uchar *)CONCAT44(local_88._4_4_,
                                           uVar6 & uVar5 & uVar4 & uVar3 & (uint)local_88);
              _libssh2_htonu32(puVar12,(uint32_t)(session->remote).kexinit_len);
              uVar3 = _libssh2_sha512_update(&fingerprint_ctx,puVar12,4);
              uVar4 = _libssh2_sha512_update
                                (&fingerprint_ctx,(session->remote).kexinit,
                                 (session->remote).kexinit_len);
              _libssh2_htonu32(puVar12,session->server_hostkey_len);
              uVar5 = _libssh2_sha512_update(&fingerprint_ctx,puVar12,4);
              uVar6 = _libssh2_sha512_update
                                (&fingerprint_ctx,session->server_hostkey,
                                 (ulong)session->server_hostkey_len);
              puVar13 = local_80;
              _libssh2_htonu32(puVar12,(uint32_t)local_80);
              uVar7 = _libssh2_sha512_update(&fingerprint_ctx,puVar12,4);
              uVar7 = uVar7 & uVar6 & uVar5 & uVar4 & uVar3 & (uint)local_88;
              uVar3 = _libssh2_sha512_update(&fingerprint_ctx,public_key,(size_t)puVar13);
              _libssh2_htonu32(puVar12,(uint32_t)server_public_key_len);
              uVar4 = _libssh2_sha512_update(&fingerprint_ctx,puVar12,4);
              uVar5 = _libssh2_sha512_update
                                (&fingerprint_ctx,
                                 (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                                 CONCAT44(server_public_key_len._4_4_,
                                          (uint32_t)server_public_key_len));
              uVar6 = _libssh2_sha512_update
                                (&fingerprint_ctx,local_90->k_value,local_90->k_value_len);
              if ((uVar5 & uVar4 & uVar3 & uVar7 & uVar6) == 0) {
LAB_00116df6:
                iVar2 = -1;
                pkVar22 = local_90;
              }
              else {
                iVar8 = _libssh2_sha512_final(&fingerprint_ctx,puVar12);
                iVar2 = -1;
                pkVar22 = local_90;
                if (iVar8 != 0) {
                  pLVar11 = session->hostkey;
                  puVar12 = *local_38;
                  sVar23 = *local_40;
                  sVar21 = 0x40;
LAB_00116ba4:
                  puVar13 = pkVar1->h_sig_comp;
LAB_00116de6:
                  pkVar22 = local_90;
                  iVar2 = (*pLVar11->sig_verify)(session,puVar12,sVar23,puVar13,sVar21,local_48);
                  iVar2 = -(uint)(iVar2 != 0);
                }
              }
            }
LAB_00116e00:
            if (iVar2 != 0) {
              pcVar17 = "Unable to verify hostkey signature ECDH";
              iVar2 = -0xb;
              goto LAB_00116f06;
            }
          }
          else {
            if (type == LIBSSH2_EC_CURVE_NISTP384) {
              iVar8 = _libssh2_sha384_init(&fingerprint_ctx);
              iVar2 = -1;
              if (iVar8 != 0) {
                pkVar1->exchange_hash = &fingerprint_ctx;
                puVar13 = (session->local).banner;
                puVar12 = pkVar1->h_sig_comp;
                if (puVar13 == (uchar *)0x0) {
                  _libssh2_htonu32(puVar12,0x1a);
                  uVar3 = _libssh2_sha384_update(&fingerprint_ctx,puVar12,4);
                  pcVar17 = "SSH-2.0-libssh2_1.11.1_DEV";
                  sVar23 = 0x1a;
                }
                else {
                  sVar10 = strlen((char *)puVar13);
                  _libssh2_htonu32(puVar12,(int)sVar10 - 2);
                  uVar3 = _libssh2_sha384_update(&fingerprint_ctx,puVar12,4);
                  pcVar17 = (char *)(session->local).banner;
                  sVar10 = strlen(pcVar17);
                  sVar23 = sVar10 - 2;
                }
                uVar4 = _libssh2_sha384_update(&fingerprint_ctx,pcVar17,sVar23);
                local_88._0_4_ = uVar4 & uVar3 & 1;
                sVar10 = strlen((char *)(session->remote).banner);
                _libssh2_htonu32(puVar12,(uint32_t)sVar10);
                uVar3 = _libssh2_sha384_update(&fingerprint_ctx,puVar12,4);
                puVar13 = (session->remote).banner;
                sVar10 = strlen((char *)puVar13);
                uVar4 = _libssh2_sha384_update(&fingerprint_ctx,puVar13,sVar10);
                _libssh2_htonu32(puVar12,(uint32_t)(session->local).kexinit_len);
                uVar5 = _libssh2_sha384_update(&fingerprint_ctx,puVar12,4);
                uVar6 = _libssh2_sha384_update
                                  (&fingerprint_ctx,(session->local).kexinit,
                                   (session->local).kexinit_len);
                local_88 = (uchar *)CONCAT44(local_88._4_4_,
                                             uVar6 & uVar5 & uVar4 & uVar3 & (uint)local_88);
                _libssh2_htonu32(puVar12,(uint32_t)(session->remote).kexinit_len);
                uVar3 = _libssh2_sha384_update(&fingerprint_ctx,puVar12,4);
                uVar4 = _libssh2_sha384_update
                                  (&fingerprint_ctx,(session->remote).kexinit,
                                   (session->remote).kexinit_len);
                _libssh2_htonu32(puVar12,session->server_hostkey_len);
                uVar5 = _libssh2_sha384_update(&fingerprint_ctx,puVar12,4);
                uVar6 = _libssh2_sha384_update
                                  (&fingerprint_ctx,session->server_hostkey,
                                   (ulong)session->server_hostkey_len);
                puVar13 = local_80;
                _libssh2_htonu32(puVar12,(uint32_t)local_80);
                uVar7 = _libssh2_sha384_update(&fingerprint_ctx,puVar12,4);
                uVar7 = uVar7 & uVar6 & uVar5 & uVar4 & uVar3 & (uint)local_88;
                uVar3 = _libssh2_sha384_update(&fingerprint_ctx,public_key,(size_t)puVar13);
                _libssh2_htonu32(puVar12,(uint32_t)server_public_key_len);
                uVar4 = _libssh2_sha384_update(&fingerprint_ctx,puVar12,4);
                uVar5 = _libssh2_sha384_update
                                  (&fingerprint_ctx,
                                   (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                                   CONCAT44(server_public_key_len._4_4_,
                                            (uint32_t)server_public_key_len));
                uVar6 = _libssh2_sha384_update
                                  (&fingerprint_ctx,local_90->k_value,local_90->k_value_len);
                if ((uVar5 & uVar4 & uVar3 & uVar7 & uVar6) == 0) goto LAB_00116df6;
                iVar8 = _libssh2_sha384_final(&fingerprint_ctx,puVar12);
                iVar2 = -1;
                pkVar22 = local_90;
                if (iVar8 != 0) {
                  pLVar11 = session->hostkey;
                  puVar12 = *local_38;
                  sVar23 = *local_40;
                  sVar21 = 0x30;
                  goto LAB_00116ba4;
                }
              }
              goto LAB_00116e00;
            }
            if (type == LIBSSH2_EC_CURVE_NISTP256) {
              iVar8 = _libssh2_sha256_init(&fingerprint_ctx);
              iVar2 = -1;
              if (iVar8 != 0) {
                pkVar1->exchange_hash = &fingerprint_ctx;
                puVar13 = (session->local).banner;
                puVar12 = pkVar1->h_sig_comp;
                local_88 = puVar12;
                if (puVar13 == (uchar *)0x0) {
                  _libssh2_htonu32(puVar12,0x1a);
                  uVar3 = _libssh2_sha256_update(&fingerprint_ctx,puVar12,4);
                  pcVar17 = "SSH-2.0-libssh2_1.11.1_DEV";
                  sVar23 = 0x1a;
                }
                else {
                  sVar10 = strlen((char *)puVar13);
                  puVar12 = local_88;
                  _libssh2_htonu32(local_88,(int)sVar10 - 2);
                  uVar3 = _libssh2_sha256_update(&fingerprint_ctx,puVar12,4);
                  pcVar17 = (char *)(session->local).banner;
                  sVar10 = strlen(pcVar17);
                  sVar23 = sVar10 - 2;
                }
                uVar4 = _libssh2_sha256_update(&fingerprint_ctx,pcVar17,sVar23);
                local_64 = uVar4 & uVar3 & 1;
                sVar10 = strlen((char *)(session->remote).banner);
                puVar13 = local_88;
                _libssh2_htonu32(local_88,(uint32_t)sVar10);
                uVar3 = _libssh2_sha256_update(&fingerprint_ctx,puVar13,4);
                puVar12 = (session->remote).banner;
                sVar10 = strlen((char *)puVar12);
                uVar4 = _libssh2_sha256_update(&fingerprint_ctx,puVar12,sVar10);
                _libssh2_htonu32(puVar13,(uint32_t)(session->local).kexinit_len);
                uVar5 = _libssh2_sha256_update(&fingerprint_ctx,puVar13,4);
                uVar6 = _libssh2_sha256_update
                                  (&fingerprint_ctx,(session->local).kexinit,
                                   (session->local).kexinit_len);
                local_64 = uVar6 & uVar5 & uVar4 & uVar3 & local_64;
                _libssh2_htonu32(puVar13,(uint32_t)(session->remote).kexinit_len);
                uVar3 = _libssh2_sha256_update(&fingerprint_ctx,puVar13,4);
                uVar4 = _libssh2_sha256_update
                                  (&fingerprint_ctx,(session->remote).kexinit,
                                   (session->remote).kexinit_len);
                _libssh2_htonu32(puVar13,session->server_hostkey_len);
                uVar5 = _libssh2_sha256_update(&fingerprint_ctx,puVar13,4);
                uVar6 = _libssh2_sha256_update
                                  (&fingerprint_ctx,session->server_hostkey,
                                   (ulong)session->server_hostkey_len);
                puVar12 = local_80;
                _libssh2_htonu32(puVar13,(uint32_t)local_80);
                uVar7 = _libssh2_sha256_update(&fingerprint_ctx,puVar13,4);
                uVar7 = uVar7 & uVar6 & uVar5 & uVar4 & uVar3 & local_64;
                uVar3 = _libssh2_sha256_update(&fingerprint_ctx,public_key,(size_t)puVar12);
                _libssh2_htonu32(puVar13,(uint32_t)server_public_key_len);
                uVar4 = _libssh2_sha256_update(&fingerprint_ctx,puVar13,4);
                uVar5 = _libssh2_sha256_update
                                  (&fingerprint_ctx,
                                   (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                                   CONCAT44(server_public_key_len._4_4_,
                                            (uint32_t)server_public_key_len));
                uVar6 = _libssh2_sha256_update
                                  (&fingerprint_ctx,local_90->k_value,local_90->k_value_len);
                if ((uVar5 & uVar4 & uVar3 & uVar7 & uVar6) == 0) goto LAB_00116df6;
                iVar8 = _libssh2_sha256_final(&fingerprint_ctx,local_88);
                iVar2 = -1;
                pkVar22 = local_90;
                if (iVar8 != 0) {
                  pLVar11 = session->hostkey;
                  puVar12 = *local_38;
                  sVar23 = *local_40;
                  sVar21 = 0x20;
                  puVar13 = local_88;
                  goto LAB_00116de6;
                }
              }
              goto LAB_00116e00;
            }
          }
          pkVar22->c = '\x15';
          pkVar22->state = libssh2_NB_state_sent;
switchD_001162d4_caseD_3:
          pkVar1 = local_90;
          iVar2 = _libssh2_transport_send(session,&local_90->c,1,(uchar *)0x0,0);
          if (iVar2 == -0x25) {
            return -0x25;
          }
          if (iVar2 == 0) {
            pkVar1->state = libssh2_NB_state_sent2;
switchD_001162d4_caseD_5:
            pkVar1 = local_90;
            data_00 = &local_90->tmp;
            iVar2 = _libssh2_packet_require
                              (session,'\x15',data_00,&local_90->tmp_len,0,(uchar *)0x0,0,
                               &local_90->req_state);
            if (iVar2 == -0x25) {
              return -0x25;
            }
            if (iVar2 == 0) {
              *(byte *)&session->state = (byte)session->state | 4;
              (*session->free)(*data_00,&session->abstract);
              if (session->session_id == (uchar *)0x0) {
                if (type == LIBSSH2_EC_CURVE_NISTP256) {
                  sVar23 = 0x20;
                }
                else if (type == LIBSSH2_EC_CURVE_NISTP521) {
                  sVar23 = 0x40;
                }
                else {
                  if (type != LIBSSH2_EC_CURVE_NISTP384) {
                    pcVar17 = "Unknown SHA digest for EC curve";
                    goto LAB_00117203;
                  }
                  sVar23 = 0x30;
                }
                puVar12 = (uchar *)(*session->alloc)(sVar23,&session->abstract);
                session->session_id = puVar12;
                if (puVar12 == (uchar *)0x0) {
                  pcVar17 = "Unable to allocate buffer for SHA digest";
                  goto LAB_0011632a;
                }
                memcpy(puVar12,pkVar1->h_sig_comp,sVar23);
                session->session_id_len = (uint32_t)sVar23;
              }
              pLVar14 = (session->local).crypt;
              if (pLVar14->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                (*pLVar14->dtor)(session,&(session->local).crypt_abstract);
                pLVar14 = (session->local).crypt;
              }
              if (pLVar14->init ==
                  (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
                   *)0x0) {
LAB_001176d9:
                pLVar14 = (session->remote).crypt;
                if (pLVar14->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                  (*pLVar14->dtor)(session,&(session->remote).crypt_abstract);
                  pLVar14 = (session->remote).crypt;
                }
                if (pLVar14->init ==
                    (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
                     *)0x0) {
LAB_00117dfe:
                  p_Var15 = (session->local).mac;
                  if (p_Var15->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                    (*p_Var15->dtor)(session,&(session->local).mac_abstract);
                    p_Var15 = (session->local).mac;
                  }
                  if (p_Var15->init !=
                      (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
                    server_public_key._0_4_ = 0;
                    if (type == LIBSSH2_EC_CURVE_NISTP521) {
                      puVar12 = (uchar *)(*session->alloc)((long)p_Var15->key_len + 0x40,
                                                           &session->abstract);
                      if (puVar12 == (uchar *)0x0) {
LAB_0011812d:
                        puVar12 = (uchar *)0x0;
                      }
                      else if (((session->local).mac)->key_len != 0) {
                        sVar23 = 0;
                        do {
                          iVar2 = _libssh2_sha512_init(&hash);
                          if (((iVar2 == 0) ||
                              (iVar2 = _libssh2_sha512_update
                                                 (&hash,pkVar1->k_value,pkVar1->k_value_len),
                              iVar2 == 0)) ||
                             (iVar2 = _libssh2_sha512_update(&hash,pkVar1->h_sig_comp,0x40),
                             iVar2 == 0)) goto LAB_00118132;
                          uVar18 = sVar23;
                          puVar13 = puVar12;
                          if (sVar23 == 0) {
                            iVar2 = _libssh2_sha512_update(&hash,"E",1);
                            if (iVar2 == 0) goto LAB_00118132;
                            uVar18 = (ulong)session->session_id_len;
                            puVar13 = session->session_id;
                          }
                          iVar2 = _libssh2_sha512_update(&hash,puVar13,uVar18);
                          if ((iVar2 == 0) ||
                             (iVar2 = _libssh2_sha512_final(&hash,puVar12 + sVar23), iVar2 == 0))
                          goto LAB_00118132;
                          sVar23 = sVar23 + 0x40;
                        } while (sVar23 < (ulong)(long)((session->local).mac)->key_len);
                      }
                    }
                    else if (type == LIBSSH2_EC_CURVE_NISTP384) {
                      puVar12 = (uchar *)(*session->alloc)((long)p_Var15->key_len + 0x30,
                                                           &session->abstract);
                      if (puVar12 == (uchar *)0x0) goto LAB_0011812d;
                      if (((session->local).mac)->key_len != 0) {
                        sVar23 = 0;
                        do {
                          iVar2 = _libssh2_sha384_init(&hash);
                          if (((iVar2 == 0) ||
                              (iVar2 = _libssh2_sha384_update
                                                 (&hash,pkVar1->k_value,pkVar1->k_value_len),
                              iVar2 == 0)) ||
                             (iVar2 = _libssh2_sha384_update(&hash,pkVar1->h_sig_comp,0x30),
                             iVar2 == 0)) goto LAB_00118132;
                          uVar18 = sVar23;
                          puVar13 = puVar12;
                          if (sVar23 == 0) {
                            iVar2 = _libssh2_sha384_update(&hash,"E",1);
                            if (iVar2 == 0) goto LAB_00118132;
                            uVar18 = (ulong)session->session_id_len;
                            puVar13 = session->session_id;
                          }
                          iVar2 = _libssh2_sha384_update(&hash,puVar13,uVar18);
                          if ((iVar2 == 0) ||
                             (iVar2 = _libssh2_sha384_final(&hash,puVar12 + sVar23), iVar2 == 0))
                          goto LAB_00118132;
                          sVar23 = sVar23 + 0x30;
                        } while (sVar23 < (ulong)(long)((session->local).mac)->key_len);
                      }
                    }
                    else {
                      if (type != LIBSSH2_EC_CURVE_NISTP256) goto LAB_00117dad;
                      puVar12 = (uchar *)(*session->alloc)((long)p_Var15->key_len + 0x20,
                                                           &session->abstract);
                      if (puVar12 == (uchar *)0x0) goto LAB_0011812d;
                      if (((session->local).mac)->key_len != 0) {
                        sVar23 = 0;
                        do {
                          iVar2 = _libssh2_sha256_init(&hash);
                          if (((iVar2 == 0) ||
                              (iVar2 = _libssh2_sha256_update
                                                 (&hash,pkVar1->k_value,pkVar1->k_value_len),
                              iVar2 == 0)) ||
                             (iVar2 = _libssh2_sha256_update(&hash,pkVar1->h_sig_comp,0x20),
                             iVar2 == 0)) goto LAB_00118132;
                          uVar18 = sVar23;
                          puVar13 = puVar12;
                          if (sVar23 == 0) {
                            iVar2 = _libssh2_sha256_update(&hash,"E",1);
                            if (iVar2 == 0) goto LAB_00118132;
                            uVar18 = (ulong)session->session_id_len;
                            puVar13 = session->session_id;
                          }
                          iVar2 = _libssh2_sha256_update(&hash,puVar13,uVar18);
                          if ((iVar2 == 0) ||
                             (iVar2 = _libssh2_sha256_final(&hash,puVar12 + sVar23), iVar2 == 0))
                          goto LAB_00118132;
                          sVar23 = sVar23 + 0x20;
                        } while (sVar23 < (ulong)(long)((session->local).mac)->key_len);
                      }
                    }
LAB_00118143:
                    if (puVar12 == (uchar *)0x0) goto LAB_00117dad;
                    (*((session->local).mac)->init)
                              (session,puVar12,(int *)&server_public_key,
                               &(session->local).mac_abstract);
                    if ((int)server_public_key != 0) {
                      explicit_bzero(puVar12,(long)((session->local).mac)->key_len);
                      (*session->free)(puVar12,&session->abstract);
                    }
                  }
                  p_Var15 = (session->remote).mac;
                  if (p_Var15->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                    (*p_Var15->dtor)(session,&(session->remote).mac_abstract);
                    p_Var15 = (session->remote).mac;
                  }
                  if (p_Var15->init !=
                      (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
                    server_public_key._0_4_ = 0;
                    if (type == LIBSSH2_EC_CURVE_NISTP521) {
                      puVar12 = (uchar *)(*session->alloc)((long)p_Var15->key_len + 0x40,
                                                           &session->abstract);
                      if (puVar12 == (uchar *)0x0) {
LAB_001184d9:
                        puVar12 = (uchar *)0x0;
                      }
                      else if (((session->remote).mac)->key_len != 0) {
                        sVar23 = 0;
                        do {
                          iVar2 = _libssh2_sha512_init(&hash);
                          if (((iVar2 == 0) ||
                              (iVar2 = _libssh2_sha512_update
                                                 (&hash,local_90->k_value,local_90->k_value_len),
                              iVar2 == 0)) ||
                             (iVar2 = _libssh2_sha512_update(&hash,pkVar1->h_sig_comp,0x40),
                             iVar2 == 0)) goto LAB_001184d0;
                          uVar18 = sVar23;
                          puVar13 = puVar12;
                          if (sVar23 == 0) {
                            iVar2 = _libssh2_sha512_update(&hash,"F",1);
                            if (iVar2 == 0) goto LAB_001184d0;
                            uVar18 = (ulong)session->session_id_len;
                            puVar13 = session->session_id;
                          }
                          iVar2 = _libssh2_sha512_update(&hash,puVar13,uVar18);
                          if ((iVar2 == 0) ||
                             (iVar2 = _libssh2_sha512_final(&hash,puVar12 + sVar23), iVar2 == 0))
                          goto LAB_001184d0;
                          sVar23 = sVar23 + 0x40;
                        } while (sVar23 < (ulong)(long)((session->remote).mac)->key_len);
                      }
                    }
                    else if (type == LIBSSH2_EC_CURVE_NISTP384) {
                      puVar12 = (uchar *)(*session->alloc)((long)p_Var15->key_len + 0x30,
                                                           &session->abstract);
                      if (puVar12 == (uchar *)0x0) goto LAB_001184d9;
                      if (((session->remote).mac)->key_len != 0) {
                        sVar23 = 0;
                        do {
                          iVar2 = _libssh2_sha384_init(&hash);
                          if (((iVar2 == 0) ||
                              (iVar2 = _libssh2_sha384_update
                                                 (&hash,local_90->k_value,local_90->k_value_len),
                              iVar2 == 0)) ||
                             (iVar2 = _libssh2_sha384_update(&hash,pkVar1->h_sig_comp,0x30),
                             iVar2 == 0)) goto LAB_001184d0;
                          uVar18 = sVar23;
                          puVar13 = puVar12;
                          if (sVar23 == 0) {
                            iVar2 = _libssh2_sha384_update(&hash,"F",1);
                            if (iVar2 == 0) goto LAB_001184d0;
                            uVar18 = (ulong)session->session_id_len;
                            puVar13 = session->session_id;
                          }
                          iVar2 = _libssh2_sha384_update(&hash,puVar13,uVar18);
                          if ((iVar2 == 0) ||
                             (iVar2 = _libssh2_sha384_final(&hash,puVar12 + sVar23), iVar2 == 0))
                          goto LAB_001184d0;
                          sVar23 = sVar23 + 0x30;
                        } while (sVar23 < (ulong)(long)((session->remote).mac)->key_len);
                      }
                    }
                    else {
                      if (type != LIBSSH2_EC_CURVE_NISTP256) goto LAB_00117dad;
                      puVar12 = (uchar *)(*session->alloc)((long)p_Var15->key_len + 0x20,
                                                           &session->abstract);
                      if (puVar12 == (uchar *)0x0) goto LAB_001184d9;
                      if (((session->remote).mac)->key_len != 0) {
                        sVar23 = 0;
                        do {
                          iVar2 = _libssh2_sha256_init(&hash);
                          if (((iVar2 == 0) ||
                              (iVar2 = _libssh2_sha256_update
                                                 (&hash,local_90->k_value,local_90->k_value_len),
                              iVar2 == 0)) ||
                             (iVar2 = _libssh2_sha256_update(&hash,pkVar1->h_sig_comp,0x20),
                             iVar2 == 0)) goto LAB_001184d0;
                          uVar18 = sVar23;
                          puVar13 = puVar12;
                          if (sVar23 == 0) {
                            iVar2 = _libssh2_sha256_update(&hash,"F",1);
                            if (iVar2 == 0) goto LAB_001184d0;
                            uVar18 = (ulong)session->session_id_len;
                            puVar13 = session->session_id;
                          }
                          iVar2 = _libssh2_sha256_update(&hash,puVar13,uVar18);
                          if ((iVar2 == 0) ||
                             (iVar2 = _libssh2_sha256_final(&hash,puVar12 + sVar23), iVar2 == 0))
                          goto LAB_001184d0;
                          sVar23 = sVar23 + 0x20;
                        } while (sVar23 < (ulong)(long)((session->remote).mac)->key_len);
                      }
                    }
                    if (puVar12 == (uchar *)0x0) goto LAB_00117dad;
                    (*((session->remote).mac)->init)
                              (session,puVar12,(int *)&server_public_key,
                               &(session->remote).mac_abstract);
                    if ((int)server_public_key != 0) {
                      explicit_bzero(puVar12,(long)((session->remote).mac)->key_len);
                      (*session->free)(puVar12,&session->abstract);
                    }
                  }
                  pLVar16 = (session->local).comp;
                  if (pLVar16 != (LIBSSH2_COMP_METHOD *)0x0) {
                    if (pLVar16->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                      (*pLVar16->dtor)(session,1,&(session->local).comp_abstract);
                      pLVar16 = (session->local).comp;
                      if (pLVar16 == (LIBSSH2_COMP_METHOD *)0x0) goto LAB_00118580;
                    }
                    if (pLVar16->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                      iVar8 = (*pLVar16->init)(session,1,&(session->local).comp_abstract);
                      iVar2 = -5;
                      if (iVar8 != 0) goto switchD_001162d4_caseD_1;
                    }
                  }
LAB_00118580:
                  pLVar16 = (session->remote).comp;
                  iVar2 = 0;
                  if (pLVar16 != (LIBSSH2_COMP_METHOD *)0x0) {
                    if (pLVar16->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                      iVar2 = 0;
                      (*pLVar16->dtor)(session,0,&(session->remote).comp_abstract);
                      pLVar16 = (session->remote).comp;
                      if (pLVar16 == (LIBSSH2_COMP_METHOD *)0x0) goto switchD_001162d4_caseD_1;
                    }
                    iVar2 = 0;
                    if (pLVar16->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                      iVar2 = (*pLVar16->init)(session,0,&(session->remote).comp_abstract);
                      iVar2 = (uint)(iVar2 == 0) * 5 + -5;
                    }
                  }
                  goto switchD_001162d4_caseD_1;
                }
                server_public_key._0_4_ = 0;
                server_public_key_len._0_4_ = 0;
                if (type == LIBSSH2_EC_CURVE_NISTP256) {
                  puVar12 = (uchar *)(*session->alloc)((long)pLVar14->iv_len + 0x20,
                                                       &session->abstract);
                  if (puVar12 == (uchar *)0x0) {
LAB_00117a0a:
                    puVar12 = (uchar *)0x0;
                  }
                  else if (((session->remote).crypt)->iv_len != 0) {
                    sVar23 = 0;
                    do {
                      iVar2 = _libssh2_sha256_init(&hash);
                      if (((iVar2 == 0) ||
                          (iVar2 = _libssh2_sha256_update(&hash,pkVar1->k_value,pkVar1->k_value_len)
                          , iVar2 == 0)) ||
                         (iVar2 = _libssh2_sha256_update(&hash,pkVar1->h_sig_comp,0x20), iVar2 == 0)
                         ) goto LAB_00117a0f;
                      uVar18 = sVar23;
                      puVar13 = puVar12;
                      if (sVar23 == 0) {
                        iVar2 = _libssh2_sha256_update(&hash,"B",1);
                        if (iVar2 == 0) goto LAB_00117a0f;
                        uVar18 = (ulong)session->session_id_len;
                        puVar13 = session->session_id;
                      }
                      iVar2 = _libssh2_sha256_update(&hash,puVar13,uVar18);
                      if ((iVar2 == 0) ||
                         (iVar2 = _libssh2_sha256_final(&hash,puVar12 + sVar23), iVar2 == 0))
                      goto LAB_00117a0f;
                      sVar23 = sVar23 + 0x20;
                    } while (sVar23 < (ulong)(long)((session->remote).crypt)->iv_len);
                  }
LAB_00117a20:
                  if (puVar12 != (uchar *)0x0) {
                    if (type == LIBSSH2_EC_CURVE_NISTP256) {
                      puVar13 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->
                                                                 secret_len + 0x20,
                                                           &session->abstract);
                      if (puVar13 == (uchar *)0x0) {
LAB_00117d4c:
                        puVar13 = (uchar *)0x0;
                      }
                      else if (((session->remote).crypt)->secret_len != 0) {
                        local_80 = pkVar1->h_sig_comp;
                        sVar23 = 0;
                        do {
                          iVar2 = _libssh2_sha256_init(&hash);
                          if (((iVar2 == 0) ||
                              (iVar2 = _libssh2_sha256_update
                                                 (&hash,pkVar1->k_value,pkVar1->k_value_len),
                              iVar2 == 0)) ||
                             (iVar2 = _libssh2_sha256_update(&hash,local_80,0x20), iVar2 == 0))
                          goto LAB_00117d51;
                          uVar18 = sVar23;
                          puVar20 = puVar13;
                          if (sVar23 == 0) {
                            iVar2 = _libssh2_sha256_update(&hash,"D",1);
                            if (iVar2 == 0) goto LAB_00117d51;
                            uVar18 = (ulong)session->session_id_len;
                            puVar20 = session->session_id;
                          }
                          iVar2 = _libssh2_sha256_update(&hash,puVar20,uVar18);
                          if ((iVar2 == 0) ||
                             (iVar2 = _libssh2_sha256_final(&hash,puVar13 + sVar23), iVar2 == 0))
                          goto LAB_00117d51;
                          sVar23 = sVar23 + 0x20;
                        } while (sVar23 < (ulong)(long)((session->remote).crypt)->secret_len);
                      }
                    }
                    else if (type == LIBSSH2_EC_CURVE_NISTP521) {
                      puVar13 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->
                                                                 secret_len + 0x40,
                                                           &session->abstract);
                      if (puVar13 == (uchar *)0x0) goto LAB_00117d4c;
                      if (((session->remote).crypt)->secret_len != 0) {
                        local_80 = pkVar1->h_sig_comp;
                        sVar23 = 0;
                        do {
                          iVar2 = _libssh2_sha512_init(&hash);
                          if (((iVar2 == 0) ||
                              (iVar2 = _libssh2_sha512_update
                                                 (&hash,pkVar1->k_value,pkVar1->k_value_len),
                              iVar2 == 0)) ||
                             (iVar2 = _libssh2_sha512_update(&hash,local_80,0x40), iVar2 == 0))
                          goto LAB_00117d51;
                          uVar18 = sVar23;
                          puVar20 = puVar13;
                          if (sVar23 == 0) {
                            iVar2 = _libssh2_sha512_update(&hash,"D",1);
                            if (iVar2 == 0) goto LAB_00117d51;
                            uVar18 = (ulong)session->session_id_len;
                            puVar20 = session->session_id;
                          }
                          iVar2 = _libssh2_sha512_update(&hash,puVar20,uVar18);
                          if ((iVar2 == 0) ||
                             (iVar2 = _libssh2_sha512_final(&hash,puVar13 + sVar23), iVar2 == 0))
                          goto LAB_00117d51;
                          sVar23 = sVar23 + 0x40;
                        } while (sVar23 < (ulong)(long)((session->remote).crypt)->secret_len);
                      }
                    }
                    else {
                      if (type != LIBSSH2_EC_CURVE_NISTP384) goto LAB_00117da4;
                      puVar13 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->
                                                                 secret_len + 0x30,
                                                           &session->abstract);
                      if (puVar13 == (uchar *)0x0) goto LAB_00117d4c;
                      if (((session->remote).crypt)->secret_len != 0) {
                        local_80 = pkVar1->h_sig_comp;
                        sVar23 = 0;
                        do {
                          iVar2 = _libssh2_sha384_init(&hash);
                          if (((iVar2 == 0) ||
                              (iVar2 = _libssh2_sha384_update
                                                 (&hash,pkVar1->k_value,pkVar1->k_value_len),
                              iVar2 == 0)) ||
                             (iVar2 = _libssh2_sha384_update(&hash,local_80,0x30), iVar2 == 0))
                          goto LAB_00117d51;
                          uVar18 = sVar23;
                          puVar20 = puVar13;
                          if (sVar23 == 0) {
                            iVar2 = _libssh2_sha384_update(&hash,"D",1);
                            if (iVar2 == 0) goto LAB_00117d51;
                            uVar18 = (ulong)session->session_id_len;
                            puVar20 = session->session_id;
                          }
                          iVar2 = _libssh2_sha384_update(&hash,puVar20,uVar18);
                          if ((iVar2 == 0) ||
                             (iVar2 = _libssh2_sha384_final(&hash,puVar13 + sVar23), iVar2 == 0))
                          goto LAB_00117d51;
                          sVar23 = sVar23 + 0x30;
                        } while (sVar23 < (ulong)(long)((session->remote).crypt)->secret_len);
                      }
                    }
LAB_00117d62:
                    if (puVar13 == (uchar *)0x0) goto LAB_00117da4;
                    pLVar14 = (session->remote).crypt;
                    iVar2 = (*pLVar14->init)(session,pLVar14,puVar12,(int *)&server_public_key,
                                             puVar13,(int *)&server_public_key_len,0,
                                             &(session->remote).crypt_abstract);
                    if (iVar2 != 0) goto LAB_00117d96;
                    if ((int)server_public_key != 0) {
                      explicit_bzero(puVar12,(long)((session->remote).crypt)->iv_len);
                      (*session->free)(puVar12,&session->abstract);
                    }
                    if ((uint32_t)server_public_key_len != 0) {
                      explicit_bzero(puVar13,(long)((session->remote).crypt)->secret_len);
                      (*session->free)(puVar13,&session->abstract);
                    }
                    goto LAB_00117dfe;
                  }
                }
                else {
                  if (type == LIBSSH2_EC_CURVE_NISTP521) {
                    puVar12 = (uchar *)(*session->alloc)((long)pLVar14->iv_len + 0x40,
                                                         &session->abstract);
                    if (puVar12 == (uchar *)0x0) goto LAB_00117a0a;
                    if (((session->remote).crypt)->iv_len != 0) {
                      sVar23 = 0;
                      do {
                        iVar2 = _libssh2_sha512_init(&hash);
                        if (((iVar2 == 0) ||
                            (iVar2 = _libssh2_sha512_update
                                               (&hash,pkVar1->k_value,pkVar1->k_value_len),
                            iVar2 == 0)) ||
                           (iVar2 = _libssh2_sha512_update(&hash,pkVar1->h_sig_comp,0x40),
                           iVar2 == 0)) goto LAB_00117a0f;
                        uVar18 = sVar23;
                        puVar13 = puVar12;
                        if (sVar23 == 0) {
                          iVar2 = _libssh2_sha512_update(&hash,"B",1);
                          if (iVar2 == 0) goto LAB_00117a0f;
                          uVar18 = (ulong)session->session_id_len;
                          puVar13 = session->session_id;
                        }
                        iVar2 = _libssh2_sha512_update(&hash,puVar13,uVar18);
                        if ((iVar2 == 0) ||
                           (iVar2 = _libssh2_sha512_final(&hash,puVar12 + sVar23), iVar2 == 0))
                        goto LAB_00117a0f;
                        sVar23 = sVar23 + 0x40;
                      } while (sVar23 < (ulong)(long)((session->remote).crypt)->iv_len);
                    }
                    goto LAB_00117a20;
                  }
                  if (type == LIBSSH2_EC_CURVE_NISTP384) {
                    puVar12 = (uchar *)(*session->alloc)((long)pLVar14->iv_len + 0x30,
                                                         &session->abstract);
                    if (puVar12 == (uchar *)0x0) goto LAB_00117a0a;
                    if (((session->remote).crypt)->iv_len != 0) {
                      sVar23 = 0;
                      do {
                        iVar2 = _libssh2_sha384_init(&hash);
                        if (((iVar2 == 0) ||
                            (iVar2 = _libssh2_sha384_update
                                               (&hash,pkVar1->k_value,pkVar1->k_value_len),
                            iVar2 == 0)) ||
                           (iVar2 = _libssh2_sha384_update(&hash,pkVar1->h_sig_comp,0x30),
                           iVar2 == 0)) goto LAB_00117a0f;
                        uVar18 = sVar23;
                        puVar13 = puVar12;
                        if (sVar23 == 0) {
                          iVar2 = _libssh2_sha384_update(&hash,"B",1);
                          if (iVar2 == 0) goto LAB_00117a0f;
                          uVar18 = (ulong)session->session_id_len;
                          puVar13 = session->session_id;
                        }
                        iVar2 = _libssh2_sha384_update(&hash,puVar13,uVar18);
                        if ((iVar2 == 0) ||
                           (iVar2 = _libssh2_sha384_final(&hash,puVar12 + sVar23), iVar2 == 0))
                        goto LAB_00117a0f;
                        sVar23 = sVar23 + 0x30;
                      } while (sVar23 < (ulong)(long)((session->remote).crypt)->iv_len);
                    }
                    goto LAB_00117a20;
                  }
                }
              }
              else {
                server_public_key._0_4_ = 0;
                server_public_key_len._0_4_ = 0;
                if (type == LIBSSH2_EC_CURVE_NISTP256) {
                  puVar12 = (uchar *)(*session->alloc)((long)pLVar14->iv_len + 0x20,
                                                       &session->abstract);
                  if (puVar12 == (uchar *)0x0) {
LAB_001172f4:
                    puVar12 = (uchar *)0x0;
                  }
                  else if (((session->local).crypt)->iv_len != 0) {
                    sVar23 = 0;
                    do {
                      iVar2 = _libssh2_sha256_init(&hash);
                      if (((iVar2 == 0) ||
                          (iVar2 = _libssh2_sha256_update(&hash,pkVar1->k_value,pkVar1->k_value_len)
                          , iVar2 == 0)) ||
                         (iVar2 = _libssh2_sha256_update(&hash,pkVar1->h_sig_comp,0x20), iVar2 == 0)
                         ) goto LAB_001172f9;
                      uVar18 = sVar23;
                      puVar13 = puVar12;
                      if (sVar23 == 0) {
                        iVar2 = _libssh2_sha256_update(&hash,"A",1);
                        if (iVar2 == 0) goto LAB_001172f9;
                        uVar18 = (ulong)session->session_id_len;
                        puVar13 = session->session_id;
                      }
                      iVar2 = _libssh2_sha256_update(&hash,puVar13,uVar18);
                      if ((iVar2 == 0) ||
                         (iVar2 = _libssh2_sha256_final(&hash,puVar12 + sVar23), iVar2 == 0))
                      goto LAB_001172f9;
                      sVar23 = sVar23 + 0x20;
                    } while (sVar23 < (ulong)(long)((session->local).crypt)->iv_len);
                  }
                }
                else if (type == LIBSSH2_EC_CURVE_NISTP521) {
                  puVar12 = (uchar *)(*session->alloc)((long)pLVar14->iv_len + 0x40,
                                                       &session->abstract);
                  if (puVar12 == (uchar *)0x0) goto LAB_001172f4;
                  if (((session->local).crypt)->iv_len != 0) {
                    sVar23 = 0;
                    do {
                      iVar2 = _libssh2_sha512_init(&hash);
                      if (((iVar2 == 0) ||
                          (iVar2 = _libssh2_sha512_update(&hash,pkVar1->k_value,pkVar1->k_value_len)
                          , iVar2 == 0)) ||
                         (iVar2 = _libssh2_sha512_update(&hash,pkVar1->h_sig_comp,0x40), iVar2 == 0)
                         ) goto LAB_001172f9;
                      uVar18 = sVar23;
                      puVar13 = puVar12;
                      if (sVar23 == 0) {
                        iVar2 = _libssh2_sha512_update(&hash,"A",1);
                        if (iVar2 == 0) goto LAB_001172f9;
                        uVar18 = (ulong)session->session_id_len;
                        puVar13 = session->session_id;
                      }
                      iVar2 = _libssh2_sha512_update(&hash,puVar13,uVar18);
                      if ((iVar2 == 0) ||
                         (iVar2 = _libssh2_sha512_final(&hash,puVar12 + sVar23), iVar2 == 0))
                      goto LAB_001172f9;
                      sVar23 = sVar23 + 0x40;
                    } while (sVar23 < (ulong)(long)((session->local).crypt)->iv_len);
                  }
                }
                else {
                  iVar2 = -1;
                  if (type != LIBSSH2_EC_CURVE_NISTP384) goto switchD_001162d4_caseD_1;
                  puVar12 = (uchar *)(*session->alloc)((long)pLVar14->iv_len + 0x30,
                                                       &session->abstract);
                  if (puVar12 == (uchar *)0x0) goto LAB_001172f4;
                  if (((session->local).crypt)->iv_len != 0) {
                    sVar23 = 0;
                    do {
                      iVar2 = _libssh2_sha384_init(&hash);
                      if (((iVar2 == 0) ||
                          (iVar2 = _libssh2_sha384_update(&hash,pkVar1->k_value,pkVar1->k_value_len)
                          , iVar2 == 0)) ||
                         (iVar2 = _libssh2_sha384_update(&hash,pkVar1->h_sig_comp,0x30), iVar2 == 0)
                         ) goto LAB_001172f9;
                      uVar18 = sVar23;
                      puVar13 = puVar12;
                      if (sVar23 == 0) {
                        iVar2 = _libssh2_sha384_update(&hash,"A",1);
                        if (iVar2 == 0) goto LAB_001172f9;
                        uVar18 = (ulong)session->session_id_len;
                        puVar13 = session->session_id;
                      }
                      iVar2 = _libssh2_sha384_update(&hash,puVar13,uVar18);
                      if ((iVar2 == 0) ||
                         (iVar2 = _libssh2_sha384_final(&hash,puVar12 + sVar23), iVar2 == 0))
                      goto LAB_001172f9;
                      sVar23 = sVar23 + 0x30;
                    } while (sVar23 < (ulong)(long)((session->local).crypt)->iv_len);
                  }
                }
LAB_0011730a:
                if (puVar12 == (uchar *)0x0) {
                  iVar2 = -1;
                  goto switchD_001162d4_caseD_1;
                }
                if (type == LIBSSH2_EC_CURVE_NISTP256) {
                  puVar13 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len +
                                                       0x20,&session->abstract);
                  if (puVar13 == (uchar *)0x0) {
LAB_00117641:
                    puVar13 = (uchar *)0x0;
                  }
                  else if (((session->local).crypt)->secret_len != 0) {
                    local_80 = pkVar1->h_sig_comp;
                    sVar23 = 0;
                    do {
                      iVar2 = _libssh2_sha256_init(&hash);
                      if (((iVar2 == 0) ||
                          (iVar2 = _libssh2_sha256_update(&hash,pkVar1->k_value,pkVar1->k_value_len)
                          , iVar2 == 0)) ||
                         (iVar2 = _libssh2_sha256_update(&hash,local_80,0x20), iVar2 == 0))
                      goto LAB_00117646;
                      uVar18 = sVar23;
                      puVar20 = puVar13;
                      if (sVar23 == 0) {
                        iVar2 = _libssh2_sha256_update(&hash,"C",1);
                        if (iVar2 == 0) goto LAB_00117646;
                        uVar18 = (ulong)session->session_id_len;
                        puVar20 = session->session_id;
                      }
                      iVar2 = _libssh2_sha256_update(&hash,puVar20,uVar18);
                      if ((iVar2 == 0) ||
                         (iVar2 = _libssh2_sha256_final(&hash,puVar13 + sVar23), iVar2 == 0))
                      goto LAB_00117646;
                      sVar23 = sVar23 + 0x20;
                    } while (sVar23 < (ulong)(long)((session->local).crypt)->secret_len);
                  }
LAB_00117657:
                  if (puVar13 != (uchar *)0x0) {
                    pLVar14 = (session->local).crypt;
                    iVar2 = (*pLVar14->init)(session,pLVar14,puVar12,(int *)&server_public_key,
                                             puVar13,(int *)&server_public_key_len,1,
                                             &(session->local).crypt_abstract);
                    if (iVar2 == 0) {
                      if ((int)server_public_key != 0) {
                        explicit_bzero(puVar12,(long)((session->local).crypt)->iv_len);
                        (*session->free)(puVar12,&session->abstract);
                      }
                      if ((uint32_t)server_public_key_len != 0) {
                        explicit_bzero(puVar13,(long)((session->local).crypt)->secret_len);
                        (*session->free)(puVar13,&session->abstract);
                      }
                      goto LAB_001176d9;
                    }
LAB_00117d96:
                    (*session->free)(puVar12,&session->abstract);
                    puVar12 = puVar13;
                  }
                }
                else {
                  if (type == LIBSSH2_EC_CURVE_NISTP521) {
                    puVar13 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len
                                                         + 0x40,&session->abstract);
                    if (puVar13 == (uchar *)0x0) goto LAB_00117641;
                    if (((session->local).crypt)->secret_len != 0) {
                      local_80 = pkVar1->h_sig_comp;
                      sVar23 = 0;
                      do {
                        iVar2 = _libssh2_sha512_init(&hash);
                        if (((iVar2 == 0) ||
                            (iVar2 = _libssh2_sha512_update
                                               (&hash,pkVar1->k_value,pkVar1->k_value_len),
                            iVar2 == 0)) ||
                           (iVar2 = _libssh2_sha512_update(&hash,local_80,0x40), iVar2 == 0))
                        goto LAB_00117646;
                        uVar18 = sVar23;
                        puVar20 = puVar13;
                        if (sVar23 == 0) {
                          iVar2 = _libssh2_sha512_update(&hash,"C",1);
                          if (iVar2 == 0) goto LAB_00117646;
                          uVar18 = (ulong)session->session_id_len;
                          puVar20 = session->session_id;
                        }
                        iVar2 = _libssh2_sha512_update(&hash,puVar20,uVar18);
                        if ((iVar2 == 0) ||
                           (iVar2 = _libssh2_sha512_final(&hash,puVar13 + sVar23), iVar2 == 0))
                        goto LAB_00117646;
                        sVar23 = sVar23 + 0x40;
                      } while (sVar23 < (ulong)(long)((session->local).crypt)->secret_len);
                    }
                    goto LAB_00117657;
                  }
                  if (type == LIBSSH2_EC_CURVE_NISTP384) {
                    puVar13 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len
                                                         + 0x30,&session->abstract);
                    if (puVar13 == (uchar *)0x0) goto LAB_00117641;
                    if (((session->local).crypt)->secret_len != 0) {
                      local_80 = pkVar1->h_sig_comp;
                      sVar23 = 0;
                      do {
                        iVar2 = _libssh2_sha384_init(&hash);
                        if (((iVar2 == 0) ||
                            (iVar2 = _libssh2_sha384_update
                                               (&hash,pkVar1->k_value,pkVar1->k_value_len),
                            iVar2 == 0)) ||
                           (iVar2 = _libssh2_sha384_update(&hash,local_80,0x30), iVar2 == 0))
                        goto LAB_00117646;
                        uVar18 = sVar23;
                        puVar20 = puVar13;
                        if (sVar23 == 0) {
                          iVar2 = _libssh2_sha384_update(&hash,"C",1);
                          if (iVar2 == 0) goto LAB_00117646;
                          uVar18 = (ulong)session->session_id_len;
                          puVar20 = session->session_id;
                        }
                        iVar2 = _libssh2_sha384_update(&hash,puVar20,uVar18);
                        if ((iVar2 == 0) ||
                           (iVar2 = _libssh2_sha384_final(&hash,puVar13 + sVar23), iVar2 == 0))
                        goto LAB_00117646;
                        sVar23 = sVar23 + 0x30;
                      } while (sVar23 < (ulong)(long)((session->local).crypt)->secret_len);
                    }
                    goto LAB_00117657;
                  }
                }
LAB_00117da4:
                (*session->free)(puVar12,&session->abstract);
              }
LAB_00117dad:
              iVar2 = -5;
              goto switchD_001162d4_caseD_1;
            }
            pcVar17 = "Timed out waiting for NEWKEYS ECDH";
          }
          else {
            pcVar17 = "Unable to send NEWKEYS message ECDH";
          }
        }
        else {
          pcVar17 = "Unable to create ECDH shared secret";
LAB_00117203:
          iVar2 = -5;
        }
      }
      else {
        pcVar17 = "Unexpected key length ECDH";
        iVar2 = -0xe;
      }
    }
    else {
      pcVar17 = "Unable to initialize hostkey importer ECDH";
LAB_00116451:
      iVar2 = -10;
    }
  }
  else {
    pcVar17 = "Unable to allocate memory for a copy of the host ECDH key";
LAB_0011632a:
    iVar2 = -6;
  }
LAB_00116f06:
  iVar2 = _libssh2_error(session,iVar2,pcVar17);
switchD_001162d4_caseD_1:
  pkVar1 = local_90;
  BN_clear_free((BIGNUM *)local_90->k);
  pkVar1->k = (BIGNUM *)0x0;
  if (pkVar1->k_value != (uchar *)0x0) {
    (*session->free)(pkVar1->k_value,&session->abstract);
    pkVar1->k_value = (uchar *)0x0;
  }
  pkVar1->state = libssh2_NB_state_idle;
  return iVar2;
LAB_001172f9:
  (*session->free)(puVar12,&session->abstract);
  puVar12 = (uchar *)0x0;
  goto LAB_0011730a;
LAB_00117646:
  (*session->free)(puVar13,&session->abstract);
  puVar13 = (uchar *)0x0;
  goto LAB_00117657;
LAB_00117a0f:
  (*session->free)(puVar12,&session->abstract);
  puVar12 = (uchar *)0x0;
  goto LAB_00117a20;
LAB_00117d51:
  (*session->free)(puVar13,&session->abstract);
  puVar13 = (uchar *)0x0;
  goto LAB_00117d62;
LAB_00118132:
  (*session->free)(puVar12,&session->abstract);
  puVar12 = (uchar *)0x0;
  goto LAB_00118143;
LAB_001184d0:
  (*session->free)(puVar12,&session->abstract);
  goto LAB_001184d9;
}

Assistant:

static int ecdh_sha2_nistp(LIBSSH2_SESSION *session, libssh2_curve_type type,
                           unsigned char *data, size_t data_len,
                           unsigned char *public_key,
                           size_t public_key_len, _libssh2_ec_key *private_key,
                           kmdhgGPshakex_state_t *exchange_state)
{
    int ret = 0;
    int rc;

    if(data_len < 5) {
        ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                             "Host key data is too short");
        return ret;
    }

    if(exchange_state->state == libssh2_NB_state_idle) {

        /* Setup initial values */
        exchange_state->k = _libssh2_bn_init();

        exchange_state->state = libssh2_NB_state_created;
    }

    if(exchange_state->state == libssh2_NB_state_created) {
        /* parse INIT reply data */

        /* host key K_S */
        unsigned char *server_public_key;
        size_t server_public_key_len;
        struct string_buf buf;

        buf.data = data;
        buf.len = data_len;
        buf.dataptr = buf.data;
        buf.dataptr++; /* Advance past packet type */

        if(_libssh2_copy_string(session, &buf, &(session->server_hostkey),
                                &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate memory for a copy "
                                 "of the host ECDH key");
            goto clean_exit;
        }

        session->server_hostkey_len = (uint32_t)server_public_key_len;

#if LIBSSH2_MD5
        {
            libssh2_md5_ctx fingerprint_ctx;

            if(libssh2_md5_init(&fingerprint_ctx) &&
               libssh2_md5_update(fingerprint_ctx, session->server_hostkey,
                                  session->server_hostkey_len) &&
               libssh2_md5_final(fingerprint_ctx,
                                 session->server_hostkey_md5)) {
                session->server_hostkey_md5_valid = TRUE;
            }
            else {
                session->server_hostkey_md5_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[50], *fprint = fingerprint;
            int i;
            for(i = 0; i < 16; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_md5[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's MD5 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */
#endif /* ! LIBSSH2_MD5 */

        {
            libssh2_sha1_ctx fingerprint_ctx;

            if(libssh2_sha1_init(&fingerprint_ctx) &&
               libssh2_sha1_update(fingerprint_ctx, session->server_hostkey,
                                   session->server_hostkey_len) &&
               libssh2_sha1_final(fingerprint_ctx,
                                  session->server_hostkey_sha1)) {
                session->server_hostkey_sha1_valid = TRUE;
            }
            else {
                session->server_hostkey_sha1_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[64], *fprint = fingerprint;
            int i;
            for(i = 0; i < 20; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_sha1[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's SHA1 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */

        /* SHA256 */
        {
            libssh2_sha256_ctx fingerprint_ctx;

            if(libssh2_sha256_init(&fingerprint_ctx) &&
               libssh2_sha256_update(fingerprint_ctx, session->server_hostkey,
                                     session->server_hostkey_len) &&
               libssh2_sha256_final(fingerprint_ctx,
                                    session->server_hostkey_sha256)) {
                session->server_hostkey_sha256_valid = TRUE;
            }
            else {
                session->server_hostkey_sha256_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char *base64Fingerprint = NULL;
            _libssh2_base64_encode(session,
                                   (const char *)
                                   session->server_hostkey_sha256,
                                   SHA256_DIGEST_LENGTH, &base64Fingerprint);
            if(base64Fingerprint) {
                _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                               "Server's SHA256 Fingerprint: %s",
                               base64Fingerprint));
                LIBSSH2_FREE(session, base64Fingerprint);
            }
        }
#endif /* LIBSSH2DEBUG */

        if(session->hostkey->init(session, session->server_hostkey,
                                  session->server_hostkey_len,
                                  &session->server_hostkey_abstract)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unable to initialize hostkey importer "
                                 "ECDH");
            goto clean_exit;
        }

        /* server public key Q_S */
        if(_libssh2_get_string(&buf, &server_public_key,
                               &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected key length ECDH");
            goto clean_exit;
        }

        /* server signature */
        if(_libssh2_get_string(&buf, &exchange_state->h_sig,
           &(exchange_state->h_sig_len))) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unexpected ECDH server sig length");
            goto clean_exit;
        }

        /* Compute the shared secret K */
        rc = _libssh2_ecdh_gen_k(&exchange_state->k, private_key,
                                 server_public_key, server_public_key_len);
        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                 "Unable to create ECDH shared secret");
            goto clean_exit;
        }

        exchange_state->k_value_len = _libssh2_bn_bytes(exchange_state->k) + 5;
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            /* don't need leading 00 */
            exchange_state->k_value_len--;
        }
        exchange_state->k_value =
        LIBSSH2_ALLOC(session, exchange_state->k_value_len);
        if(!exchange_state->k_value) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate buffer for ECDH K");
            goto clean_exit;
        }
        _libssh2_htonu32(exchange_state->k_value,
                         (uint32_t)(exchange_state->k_value_len - 4));
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 4);
        }
        else {
            exchange_state->k_value[4] = 0;
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 5);
        }

        /* verify hash */

        switch(type) {
            case LIBSSH2_EC_CURVE_NISTP256:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(256);
                break;
            case LIBSSH2_EC_CURVE_NISTP384:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(384);
                break;
            case LIBSSH2_EC_CURVE_NISTP521:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(512);
                break;
        }

        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_SIGN,
                                 "Unable to verify hostkey signature "
                                 "ECDH");
            goto clean_exit;
        }

        exchange_state->c = SSH_MSG_NEWKEYS;
        exchange_state->state = libssh2_NB_state_sent;
    }

    if(exchange_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, &exchange_state->c, 1, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send NEWKEYS message ECDH");
            goto clean_exit;
        }

        exchange_state->state = libssh2_NB_state_sent2;
    }

    if(exchange_state->state == libssh2_NB_state_sent2) {
        rc = _libssh2_packet_require(session, SSH_MSG_NEWKEYS,
                                     &exchange_state->tmp,
                                     &exchange_state->tmp_len, 0, NULL, 0,
                                     &exchange_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timed out waiting for NEWKEYS ECDH");
            goto clean_exit;
        }

        /* The first key exchange has been performed,
           switch to active crypt/comp/mac mode */
        session->state |= LIBSSH2_STATE_NEWKEYS;
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Received NEWKEYS message ECDH"));

        /* This will actually end up being just packet_type(1)
           for this packet type anyway */
        LIBSSH2_FREE(session, exchange_state->tmp);

        if(!session->session_id) {

            size_t digest_length = 0;

            if(type == LIBSSH2_EC_CURVE_NISTP256)
                digest_length = SHA256_DIGEST_LENGTH;
            else if(type == LIBSSH2_EC_CURVE_NISTP384)
                digest_length = SHA384_DIGEST_LENGTH;
            else if(type == LIBSSH2_EC_CURVE_NISTP521)
                digest_length = SHA512_DIGEST_LENGTH;
            else{
                ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                     "Unknown SHA digest for EC curve");
                goto clean_exit;

            }
            session->session_id = LIBSSH2_ALLOC(session, digest_length);
            if(!session->session_id) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                     "Unable to allocate buffer for "
                                     "SHA digest");
                goto clean_exit;
            }
            memcpy(session->session_id, exchange_state->h_sig_comp,
                   digest_length);
             session->session_id_len = (uint32_t)digest_length;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "session_id calculated"));
        }

        /* Cleanup any existing cipher */
        if(session->local.crypt->dtor) {
            session->local.crypt->dtor(session,
                                       &session->local.crypt_abstract);
        }

        /* Calculate IV/Secret/Key for each direction */
        if(session->local.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(iv,
                                                 session->local.crypt->
                                                 iv_len, "A");
            if(!iv) {
                ret = -1;
                goto clean_exit;
            }

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(secret,
                                                 session->local.crypt->
                                                 secret_len, "C");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->local.crypt->
                init(session, session->local.crypt, iv, &free_iv, secret,
                     &free_secret, 1, &session->local.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->local.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->local.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server IV and Key calculated"));

        if(session->remote.crypt->dtor) {
            /* Cleanup any existing cipher */
            session->remote.crypt->dtor(session,
                                        &session->remote.crypt_abstract);
        }

        if(session->remote.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(iv,
                                                 session->remote.crypt->
                                                 iv_len, "B");

            if(!iv) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(secret,
                                                 session->remote.crypt->
                                                 secret_len, "D");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->remote.crypt->
                init(session, session->remote.crypt, iv, &free_iv, secret,
                     &free_secret, 0, &session->remote.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->remote.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->remote.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client IV and Key calculated"));

        if(session->local.mac->dtor) {
            session->local.mac->dtor(session, &session->local.mac_abstract);
        }

        if(session->local.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(key,
                                                 session->local.mac->
                                                 key_len, "E");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->local.mac->init(session, key, &free_key,
                                     &session->local.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->local.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server HMAC Key calculated"));

        if(session->remote.mac->dtor) {
            session->remote.mac->dtor(session, &session->remote.mac_abstract);
        }

        if(session->remote.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(key,
                                                 session->remote.mac->
                                                 key_len, "F");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->remote.mac->init(session, key, &free_key,
                                      &session->remote.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->remote.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client HMAC Key calculated"));

        /* Initialize compression for each direction */

        /* Cleanup any existing compression */
        if(session->local.comp && session->local.comp->dtor) {
            session->local.comp->dtor(session, 1,
                                      &session->local.comp_abstract);
        }

        if(session->local.comp && session->local.comp->init) {
            if(session->local.comp->init(session, 1,
                                         &session->local.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server compression initialized"));

        if(session->remote.comp && session->remote.comp->dtor) {
            session->remote.comp->dtor(session, 0,
                                       &session->remote.comp_abstract);
        }

        if(session->remote.comp && session->remote.comp->init) {
            if(session->remote.comp->init(session, 0,
                                          &session->remote.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client compression initialized"));
    }

clean_exit:
    _libssh2_bn_free(exchange_state->k);
    exchange_state->k = NULL;

    if(exchange_state->k_value) {
        LIBSSH2_FREE(session, exchange_state->k_value);
        exchange_state->k_value = NULL;
    }

    exchange_state->state = libssh2_NB_state_idle;

    return ret;
}